

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O3

_Bool Curl_bufq_is_full(bufq *q)

{
  buf_chunk *pbVar1;
  
  pbVar1 = q->tail;
  if ((pbVar1 != (buf_chunk *)0x0) && (q->spare == (buf_chunk *)0x0)) {
    if (q->max_chunks <= q->chunk_count) {
      if (q->max_chunks < q->chunk_count) {
        return true;
      }
      return pbVar1->dlen <= pbVar1->w_offset;
    }
  }
  return false;
}

Assistant:

bool Curl_bufq_is_full(const struct bufq *q)
{
  if(!q->tail || q->spare)
    return FALSE;
  if(q->chunk_count < q->max_chunks)
    return FALSE;
  if(q->chunk_count > q->max_chunks)
    return TRUE;
  /* we have no spares and cannot make more, is the tail full? */
  return chunk_is_full(q->tail);
}